

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O3

int fetch_all_levels_db(feed_db_t *db,level_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  level_t *plVar4;
  uchar *puVar5;
  size_t sVar6;
  sqlite3_stmt *stmt;
  level_t record;
  char qr [56];
  sqlite3_stmt *local_100;
  uint local_f4;
  level_t local_f0;
  char local_68 [56];
  
  uVar2 = count_rows_db(db,"levels");
  if (0 < (int)uVar2) {
    builtin_strncpy(local_68,"SELECT level_id, level_index, level_name FROM `levels`;",0x38);
    sqlite3_prepare_v2(db->conn,local_68,-1,&local_100,(char **)0x0);
    plVar4 = (level_t *)malloc((ulong)uVar2 * 0x88);
    *records = plVar4;
    uVar1 = 0xffffffff;
    if (plVar4 != (level_t *)0x0) {
      sVar6 = 0;
      local_f4 = uVar2;
      do {
        iVar3 = sqlite3_step(local_100);
        db->rc = iVar3;
        uVar1 = local_f4;
        if (iVar3 != 100) break;
        init_level(&local_f0);
        puVar5 = sqlite3_column_text(local_100,0);
        strcpy(local_f0.id,(char *)puVar5);
        local_f0.index = sqlite3_column_double(local_100,1);
        puVar5 = sqlite3_column_text(local_100,2);
        strcpy(local_f0.name,(char *)puVar5);
        memcpy((*records)->id + sVar6,&local_f0,0x88);
        sVar6 = sVar6 + 0x88;
        uVar1 = local_f4;
      } while ((ulong)uVar2 * 0x88 != sVar6);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_100);
  }
  return uVar2;
}

Assistant:

int fetch_all_levels_db(feed_db_t *db, level_t **records) {

    level_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "levels");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "level_id, level_index, level_name "
                "FROM `levels`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_level(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        record.index = sqlite3_column_double(stmt, 1);
        strcpy(record.name, sqlite3_column_text(stmt, 2));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}